

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
toml::detail::
insert_nested_key<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,table_type *root,
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          iter,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               last,region *key_reg,bool is_array_of_table)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  element_type *peVar3;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *pbVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  iterator __ite;
  const_iterator cVar8;
  mapped_type *pmVar9;
  iterator iVar10;
  array_type *paVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  key_last;
  table_type *ptVar12;
  syntax_error *psVar13;
  mapped_type *pmVar14;
  char *pcVar15;
  region *k;
  _Hash_node_base *p_Var16;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  key_curr;
  __hashtable *__h;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_04;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_05;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_06;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_07;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_08;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_09;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_10;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_11;
  value_type aot;
  allocator_type local_429;
  string local_428;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *local_408;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_400;
  undefined1 local_3f8 [24];
  undefined8 uStack_3e0;
  string local_3d8;
  string local_3b8;
  string local_398;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_320;
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  _Alloc_hider local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  pointer local_2a8;
  uint_least32_t local_2a0;
  _Alloc_hider local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  pointer local_250;
  char local_248 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  undefined1 local_218 [8];
  pointer pbStack_210;
  _Alloc_hider local_208;
  size_type local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c0;
  region *local_1b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  source_location local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  undefined1 local_138 [48];
  region local_108;
  region local_c0;
  region local_78;
  
  key_last._M_current = iter._M_current;
  key_curr._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v;
  local_408 = (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)root;
  local_400._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v;
  local_320._M_current = iter._M_current;
  local_1c0 = __return_storage_ptr__;
  local_1b8 = (region *)last._M_current;
  if (v == (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)iter._M_current)
  {
    __assert_fail("iter != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/parser.hpp"
                  ,0x601,
                  "result<bool, std::string> toml::detail::insert_nested_key(typename Value::table_type &, const Value &, InputIterator, const InputIterator, region, const bool) [Value = toml::basic_value<toml::discard_comments>, InputIterator = __gnu_cxx::__normal_iterator<const std::basic_string<char> *, std::vector<std::basic_string<char>>>]"
                 );
  }
  do {
    k = (region *)(key_curr._M_current + 1);
    cVar8 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,key_curr._M_current);
    local_1b0._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)k;
    if (k == (region *)key_last._M_current) {
      if ((char)key_reg == '\0') {
        if (cVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                      *)local_318,key_curr._M_current,local_408);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                              *)local_318);
          basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
                    ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                     local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._0_8_ != &local_308) {
            operator_delete((void *)local_318._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
          }
        }
        else {
          iVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,key_curr._M_current);
          pbVar4 = local_408;
          if (iVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_00121140;
          if ((*(char *)((long)iVar10.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                               ._M_cur + 0x28) != '\n') ||
             (*(char *)&((_Hashtable *)&local_408->type_)->_M_buckets != '\n')) {
            if ((*(char *)&((_Hashtable *)&local_408->type_)->_M_buckets == '\n') &&
               (pmVar14 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                                *)this,key_curr._M_current), pmVar14->type_ == array)) {
              pmVar14 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                        ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                              *)this,key_curr._M_current);
              paVar11 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::
                        as_array(pmVar14);
              v = (paVar11->
                  super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
              if (v != (paVar11->
                       super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) {
                pmVar14 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                                *)this,key_curr._M_current);
                paVar11 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::
                          as_array(pmVar14);
                if (((paVar11->
                     super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->type_ == table) {
                  psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
                  format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (&local_3d8,(detail *)local_400._M_current,local_320,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )v);
                  concat_to_string<char_const(&)[39],std::__cxx11::string,char_const(&)[19]>
                            (&local_3b8,(toml *)"toml::insert_value: array of tables (\"",
                             (char (*) [39])&local_3d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "\") already exists.",(char (*) [19])iter._M_current);
                  pmVar14 = std::
                            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                            ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                                  *)this,key_curr._M_current);
                  source_location::source_location
                            ((source_location *)local_378,
                             (pmVar14->region_info_).
                             super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  std::
                  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<toml::source_location,_const_char_(&)[29],_true>
                            ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_318,(source_location *)local_378,
                             (char (*) [29])"array of tables defined here");
                  source_location::source_location
                            ((source_location *)local_218,
                             (region_base *)
                             (pbVar4->region_info_).
                             super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  std::
                  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<toml::source_location,_const_char_(&)[49],_true>
                            ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_2a8,(source_location *)local_218,
                             (char (*) [49])"table conflicts with the previous array of table");
                  __l_02._M_len = 2;
                  __l_02._M_array = (iterator)local_318;
                  std::
                  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_428,__l_02,(allocator_type *)&local_238);
                  local_3f8._0_8_ = (pointer)0x0;
                  local_3f8._8_8_ = (pointer)0x0;
                  local_3f8._16_8_ = (pointer)0x0;
                  format_underline(&local_398,&local_3b8,
                                   (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_428,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_3f8,false);
                  source_location::source_location
                            (&local_1a8,
                             (region_base *)
                             (pbVar4->region_info_).
                             super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
                  __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
                }
              }
            }
            psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
            format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&local_3d8,(detail *)local_400._M_current,local_320,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )v);
            concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[19]>
                      (&local_3b8,(toml *)"toml::insert_value: value (\"",(char (*) [29])&local_3d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\") already exists.",(char (*) [19])iter._M_current);
            pmVar14 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                      ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                            *)this,key_curr._M_current);
            source_location::source_location
                      ((source_location *)local_378,
                       (pmVar14->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[26],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_318,(source_location *)local_378,
                       (char (*) [26])"value already exists here");
            source_location::source_location
                      ((source_location *)local_218,
                       (region_base *)
                       (pbVar4->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[20],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2a8,(source_location *)local_218,
                       (char (*) [20])"value defined twice");
            __l_04._M_len = 2;
            __l_04._M_array = (iterator)local_318;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_428,__l_04,(allocator_type *)&local_238);
            local_3f8._0_8_ = (pointer)0x0;
            local_3f8._8_8_ = (pointer)0x0;
            local_3f8._16_8_ = (pointer)0x0;
            format_underline(&local_398,&local_3b8,
                             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_428,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_3f8,false);
            source_location::source_location
                      (&local_1a8,
                       (region_base *)
                       (pbVar4->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
            __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
          }
          iVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,key_curr._M_current);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_00121140;
          v = (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
              key_curr._M_current;
          iter._M_current = key_last._M_current;
          bVar6 = is_valid_forward_table_definition<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *
                             )((long)iVar10.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                                     ._M_cur + 0x28),local_408,local_400,key_curr,key_last);
          pbVar4 = local_408;
          if (!bVar6) {
            psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
            format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&local_3d8,(detail *)local_400._M_current,key_last,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )v);
            concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[19]>
                      (&local_3b8,(toml *)"toml::insert_value: table (\"",(char (*) [29])&local_3d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\") already exists.",(char (*) [19])iter._M_current);
            pmVar14 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                      ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                            *)this,key_curr._M_current);
            source_location::source_location
                      ((source_location *)local_378,
                       (pmVar14->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[26],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_318,(source_location *)local_378,
                       (char (*) [26])"table already exists here");
            source_location::source_location
                      ((source_location *)local_218,
                       (region_base *)
                       (pbVar4->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[20],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2a8,(source_location *)local_218,
                       (char (*) [20])"table defined twice");
            __l_03._M_len = 2;
            __l_03._M_array = (iterator)local_318;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_428,__l_03,(allocator_type *)&local_238);
            local_3f8._0_8_ = (pointer)0x0;
            local_3f8._8_8_ = (pointer)0x0;
            local_3f8._16_8_ = (pointer)0x0;
            format_underline(&local_398,&local_3b8,
                             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_428,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_3f8,false);
            source_location::source_location
                      (&local_1a8,
                       (region_base *)
                       (pbVar4->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
            __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
          }
          iVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,key_curr._M_current);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_00121140;
          key_last._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               basic_value<toml::discard_comments,std::unordered_map,std::vector>::
               as_table_abi_cxx11_((basic_value<toml::discard_comments,std::unordered_map,std::vector>
                                    *)((long)iVar10.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                                             ._M_cur + 0x28));
          ptVar12 = basic_value<toml::discard_comments,std::unordered_map,std::vector>::
                    as_table_abi_cxx11_((basic_value<toml::discard_comments,std::unordered_map,std::vector>
                                         *)local_408);
          for (p_Var16 = (ptVar12->_M_h)._M_before_begin._M_nxt; p_Var16 != (_Hash_node_base *)0x0;
              p_Var16 = p_Var16->_M_nxt) {
            iVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)this,key_curr._M_current);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                ._M_cur == (__node_type *)0x0) goto LAB_00121140;
            k = (region *)(p_Var16 + 1);
            bVar6 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::contains
                              ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector>
                                *)((long)iVar10.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                                         ._M_cur + 0x28),(key_type *)k);
            if (bVar6) goto LAB_0012114c;
            pmVar9 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)key_last._M_current,(key_type *)k);
            basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::operator=
                      (pmVar9,(basic_value<toml::discard_comments,_std::unordered_map,_std::vector>
                               *)(p_Var16 + 5));
          }
          iVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,key_curr._M_current);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_00121140;
          region::region(&local_78,local_1b8);
          change_region<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
                    ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                     ((long)iVar10.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                            ._M_cur + 0x28),&local_78);
          key_last._M_current = local_320._M_current;
          region::~region(&local_78);
        }
        local_1c0->is_ok_ = true;
        (local_1c0->field_1).succ.value = true;
      }
      else if (cVar8.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
               ._M_cur == (__node_type *)0x0) {
        local_218 = (undefined1  [8])0x0;
        pbStack_210 = (pointer)0x0;
        local_208._M_p = (pointer)0x0;
        make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                  ((string *)local_378,(detail *)(local_1b8->first_)._M_current,
                   (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                   (local_1b8->last_)._M_current,
                   (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)v);
        std::__cxx11::string::substr((ulong)local_318,(ulong)local_378);
        iVar7 = std::__cxx11::string::compare((char *)local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._0_8_ != &local_308) {
          operator_delete((void *)local_318._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._0_8_ != &local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
        }
        if (iVar7 != 0) {
          region::comments_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_378,local_1b8);
          local_308._M_allocated_capacity = (size_type)local_208._M_p;
          local_318._8_8_ = pbStack_210;
          local_318._0_8_ = local_218;
          local_218 = (undefined1  [8])local_378._0_8_;
          pbStack_210 = (pointer)local_378._8_8_;
          local_208._M_p = (pointer)local_368._M_allocated_capacity;
          local_378._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_378._8_8_ = (pointer)0x0;
          local_368._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_318);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_378);
        }
        std::
        vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
        ::vector((vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                  *)local_318,1,local_408,(allocator_type *)&local_1a8);
        region::region(&local_108,local_1b8);
        local_138._24_8_ = local_218;
        local_138._32_8_ = pbStack_210;
        local_138._40_8_ = local_208._M_p;
        local_218 = (undefined1  [8])0x0;
        pbStack_210 = (pointer)0x0;
        local_208._M_p = (pointer)0x0;
        pbVar2 = (pointer)(local_138 + 0x18);
        v = pbVar2;
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value
                  ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_378
                   ,(array_type *)local_318,&local_108,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pbVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pbVar2);
        region::~region(&local_108);
        std::
        vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
        ::~vector((vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                   *)local_318);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
        ::pair<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                    *)local_318,key_curr._M_current,
                   (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_378
                  );
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_emplace<std::pair<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>
                            *)local_318);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
                  ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_2f8
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._0_8_ != &local_308) {
          operator_delete((void *)local_318._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
        }
        local_1c0->is_ok_ = true;
        (local_1c0->field_1).succ.value = true;
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
                  ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_378
                  );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_218);
      }
      else {
        iVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)this,key_curr._M_current);
        pbVar4 = local_408;
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_00121140:
          std::__throw_out_of_range("_Map_base::at");
LAB_0012114c:
          psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
          format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_3d8,(detail *)local_400._M_current,local_320,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )v);
          concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[19]>
                    (&local_3b8,(toml *)"toml::insert_value: value (\"",(char (*) [29])&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\") already exists.",(char (*) [19])iter._M_current);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)key_last._M_current,(key_type *)k);
          source_location::source_location
                    ((source_location *)local_378,
                     (pmVar14->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[20],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_318,(source_location *)local_378,(char (*) [20])0x197343);
          source_location::source_location
                    ((source_location *)local_218,
                     (region_base *)
                     (local_408->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[19],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,(source_location *)local_218,(char (*) [19])"this defined twice")
          ;
          __l._M_len = 2;
          __l._M_array = (iterator)local_318;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_428,__l,(allocator_type *)&local_238);
          local_3f8._0_8_ = (pointer)0x0;
          local_3f8._8_8_ = (pointer)0x0;
          local_3f8._16_8_ = (pointer)0x0;
          format_underline(&local_398,&local_3b8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_428,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_3f8,false);
          source_location::source_location
                    (&local_1a8,
                     (region_base *)
                     (local_408->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
          __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        if (*(char *)((long)iVar10.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                            ._M_cur + 0x28) == '\n') {
          psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
          format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_3d8,(detail *)local_400._M_current,key_last,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )v);
          concat_to_string<char_const(&)[38],std::__cxx11::string,char_const(&)[21]>
                    (&local_3b8,(toml *)"toml::insert_value: array of table (\"",
                     (char (*) [38])&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\") cannot be defined",(char (*) [21])iter._M_current);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)this,key_curr._M_current);
          source_location::source_location
                    ((source_location *)local_378,
                     (pmVar14->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[22],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_318,(source_location *)local_378,
                     (char (*) [22])"table already defined");
          source_location::source_location
                    ((source_location *)local_218,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[39],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,(source_location *)local_218,
                     (char (*) [39])"this conflicts with the previous table");
          __l_01._M_len = 2;
          __l_01._M_array = (iterator)local_318;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_428,__l_01,(allocator_type *)&local_238);
          local_3f8._0_8_ = (pointer)0x0;
          local_3f8._8_8_ = (pointer)0x0;
          local_3f8._16_8_ = (pointer)0x0;
          format_underline(&local_398,&local_3b8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_428,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_3f8,false);
          source_location::source_location
                    (&local_1a8,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
          __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        iVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)this,key_curr._M_current);
        pbVar4 = local_408;
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00121140;
        if (*(char *)((long)iVar10.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                            ._M_cur + 0x28) != '\t') {
          psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
          format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_3d8,(detail *)local_400._M_current,key_last,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )v);
          concat_to_string<char_const(&)[38],std::__cxx11::string,char_const(&)[32]>
                    (&local_3b8,(toml *)"toml::insert_value: array of table (\"",
                     (char (*) [38])&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\") collides with existing value",(char (*) [32])iter._M_current);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)this,key_curr._M_current);
          source_location::source_location
                    ((source_location *)local_378,
                     (pmVar14->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)this,key_curr._M_current);
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_158.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,pmVar14->type_);
          concat_to_string<char_const(&)[6],toml::value_t,char_const(&)[22]>
                    (&local_428,(toml *)"this ",(char (*) [6])&local_158,
                     (value_t *)" value already exists",(char (*) [22])iter._M_current);
          local_318._8_4_ = local_378._8_4_;
          local_318._0_8_ = local_378._0_8_;
          local_308._M_allocated_capacity = (size_type)local_2f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_allocated_capacity == &local_358) {
            local_2f8._8_8_ = local_358._8_8_;
          }
          else {
            local_308._M_allocated_capacity = local_368._M_allocated_capacity;
          }
          local_2f8._0_8_ = local_358._M_allocated_capacity;
          local_2f8._16_8_ = local_2d8;
          local_308._8_8_ = local_368._8_8_;
          local_368._8_8_ = 0;
          local_358._M_allocated_capacity = local_358._M_allocated_capacity & 0xffffffffffffff00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_allocated_capacity == &local_338) {
            local_2d8._8_8_ = local_338._8_8_;
          }
          else {
            local_2f8._16_8_ = local_348._M_allocated_capacity;
          }
          local_2c8._M_p = (pointer)&local_2b8;
          local_2f8._24_8_ = local_348._8_8_;
          local_348._8_8_ = 0;
          local_338._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p == &local_428.field_2) {
            local_2b8._8_8_ = local_428.field_2._8_8_;
          }
          else {
            local_2c8._M_p = local_428._M_dataplus._M_p;
          }
          local_2c0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._M_string_length;
          local_428._M_string_length = 0;
          local_428.field_2._M_local_buf[0] = '\0';
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          local_368._M_allocated_capacity = (size_type)&local_358;
          local_348._M_allocated_capacity = (size_type)&local_338;
          source_location::source_location
                    ((source_location *)local_218,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[37],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,(source_location *)local_218,
                     (char (*) [37])"while inserting this array-of-tables");
          __l_09._M_len = 2;
          __l_09._M_array = (iterator)local_318;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_3f8,__l_09,&local_429);
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_398,&local_3b8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3f8,&local_238,false);
          source_location::source_location
                    (&local_1a8,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
          __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        iVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)this,key_curr._M_current);
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00121140;
        paVar11 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_array
                            ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *
                             )((long)iVar10.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                                     ._M_cur + 0x28));
        pbVar4 = local_408;
        pbVar2 = (paVar11->
                 super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((pbVar2 == (paVar11->
                       super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) || (pbVar2->type_ != table)) {
          psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
          format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_3d8,(detail *)local_400._M_current,local_320,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )v);
          concat_to_string<char_const(&)[38],std::__cxx11::string,char_const(&)[32]>
                    (&local_3b8,(toml *)"toml::insert_value: array of table (\"",
                     (char (*) [38])&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\") collides with existing value",(char (*) [32])iter._M_current);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)this,key_curr._M_current);
          source_location::source_location
                    ((source_location *)local_378,
                     (pmVar14->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)this,key_curr._M_current);
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_158.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,pmVar14->type_);
          concat_to_string<char_const(&)[6],toml::value_t,char_const(&)[22]>
                    (&local_428,(toml *)"this ",(char (*) [6])&local_158,
                     (value_t *)" value already exists",(char (*) [22])iter._M_current);
          local_318._8_4_ = local_378._8_4_;
          local_318._0_8_ = local_378._0_8_;
          local_308._M_allocated_capacity = (size_type)local_2f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_allocated_capacity == &local_358) {
            local_2f8._8_8_ = local_358._8_8_;
          }
          else {
            local_308._M_allocated_capacity = local_368._M_allocated_capacity;
          }
          local_2f8._0_8_ = local_358._M_allocated_capacity;
          local_2f8._16_8_ = local_2d8;
          local_308._8_8_ = local_368._8_8_;
          local_368._8_8_ = 0;
          local_358._M_allocated_capacity = local_358._M_allocated_capacity & 0xffffffffffffff00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_allocated_capacity == &local_338) {
            local_2d8._8_8_ = local_338._8_8_;
          }
          else {
            local_2f8._16_8_ = local_348._M_allocated_capacity;
          }
          local_2c8._M_p = (pointer)&local_2b8;
          local_2f8._24_8_ = local_348._8_8_;
          local_348._8_8_ = 0;
          local_338._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p == &local_428.field_2) {
            local_2b8._8_8_ = local_428.field_2._8_8_;
          }
          else {
            local_2c8._M_p = local_428._M_dataplus._M_p;
          }
          local_2c0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._M_string_length;
          local_428._M_string_length = 0;
          local_428.field_2._M_local_buf[0] = '\0';
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          local_368._M_allocated_capacity = (size_type)&local_358;
          local_348._M_allocated_capacity = (size_type)&local_338;
          source_location::source_location
                    ((source_location *)local_218,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[37],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,(source_location *)local_218,
                     (char (*) [37])"while inserting this array-of-tables");
          __l_07._M_len = 2;
          __l_07._M_array = (iterator)local_318;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_3f8,__l_07,&local_429);
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_398,&local_3b8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3f8,&local_238,false);
          source_location::source_location
                    (&local_1a8,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
          __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        peVar3 = (pbVar2->region_info_).
                 super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar3 != (element_type *)0x0) {
          (*peVar3->_vptr_region_base[4])(local_378);
          v = (pointer)0x2;
          std::__cxx11::string::substr((ulong)local_318,(ulong)local_378);
          iVar7 = std::__cxx11::string::compare(local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._0_8_ != &local_308) {
            operator_delete((void *)local_318._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
          }
          pbVar4 = local_408;
          if (iVar7 != 0) {
            psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
            format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&local_3d8,(detail *)local_400._M_current,local_320,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )v);
            concat_to_string<char_const(&)[38],std::__cxx11::string,char_const(&)[42]>
                      (&local_3b8,(toml *)"toml::insert_value: array of table (\"",
                       (char (*) [38])&local_3d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\") collides with existing array-of-tables",(char (*) [42])iter._M_current);
            pmVar14 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                      ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                            *)this,key_curr._M_current);
            source_location::source_location
                      ((source_location *)local_378,
                       (pmVar14->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            pmVar14 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                      ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                            *)this,key_curr._M_current);
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_158.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,pmVar14->type_);
            concat_to_string<char_const(&)[6],toml::value_t,char_const(&)[23]>
                      (&local_428,(toml *)"this ",(char (*) [6])&local_158,
                       (value_t *)" value has static size",(char (*) [23])iter._M_current);
            local_318._8_4_ = local_378._8_4_;
            local_318._0_8_ = local_378._0_8_;
            local_308._M_allocated_capacity = (size_type)local_2f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_allocated_capacity == &local_358) {
              local_2f8._8_8_ = local_358._8_8_;
            }
            else {
              local_308._M_allocated_capacity = local_368._M_allocated_capacity;
            }
            local_2f8._0_8_ = local_358._M_allocated_capacity;
            local_2f8._16_8_ = local_2d8;
            local_308._8_8_ = local_368._8_8_;
            local_368._8_8_ = 0;
            local_358._M_allocated_capacity = local_358._M_allocated_capacity & 0xffffffffffffff00;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_allocated_capacity == &local_338) {
              local_2d8._8_8_ = local_338._8_8_;
            }
            else {
              local_2f8._16_8_ = local_348._M_allocated_capacity;
            }
            local_2c8._M_p = (pointer)&local_2b8;
            local_2f8._24_8_ = local_348._8_8_;
            local_348._8_8_ = 0;
            local_338._M_local_buf[0] = '\0';
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p == &local_428.field_2) {
              local_2b8._8_8_ = local_428.field_2._8_8_;
            }
            else {
              local_2c8._M_p = local_428._M_dataplus._M_p;
            }
            local_2c0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._M_string_length;
            local_428._M_string_length = 0;
            local_428.field_2._M_local_buf[0] = '\0';
            local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
            local_368._M_allocated_capacity = (size_type)&local_358;
            local_348._M_allocated_capacity = (size_type)&local_338;
            source_location::source_location
                      ((source_location *)local_218,
                       (region_base *)
                       (pbVar4->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[43],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2a8,(source_location *)local_218,
                       (char (*) [43])"appending it to the statically sized array");
            __l_11._M_len = 2;
            __l_11._M_array = (iterator)local_318;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_3f8,__l_11,&local_429);
            local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_238.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_398,&local_3b8,
                             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_3f8,&local_238,false);
            source_location::source_location
                      (&local_1a8,
                       (region_base *)
                       (pbVar4->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
            __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
          }
        }
        std::
        vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
        ::push_back(paVar11,local_408);
        local_1c0->is_ok_ = true;
        (local_1c0->field_1).succ.value = true;
        key_last._M_current = local_320._M_current;
      }
    }
    else {
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_378._0_8_ = &local_348;
        local_378._8_8_ = (pointer)0x1;
        local_368._M_allocated_capacity = 0;
        local_368._8_8_ = 0;
        local_358._M_allocated_capacity = 0x3f800000;
        local_358._8_8_ = 0;
        local_348._M_allocated_capacity = 0;
        region::region(&local_c0,local_1b8);
        local_138._0_8_ = (pointer)0x0;
        local_138._8_8_ = 0;
        local_138._16_8_ = (pointer)0x0;
        v = (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_138;
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::basic_value
                  ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_318
                   ,(table_type *)local_378,&local_c0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)v);
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,key_curr._M_current);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::operator=
                  (pmVar9,(basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                          local_318);
        basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::~basic_value
                  ((basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)local_318
                  );
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
        region::~region(&local_c0);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_378);
        k = &local_c0;
      }
      iVar10 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this,key_curr._M_current);
      if (iVar10.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
          ._M_cur == (__node_type *)0x0) goto LAB_00121140;
      cVar5 = *(char *)((long)iVar10.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                              ._M_cur + 0x28);
      k = (region *)CONCAT71((int7)((ulong)k >> 8),cVar5);
      iVar10 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)this,key_curr._M_current);
      pbVar4 = local_408;
      if (cVar5 == '\n') {
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00121140;
        if ((*(long **)((long)iVar10.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                              ._M_cur + 0x58) != (long *)0x0) &&
           (cVar5 = (**(code **)(**(long **)((long)iVar10.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                                                  ._M_cur + 0x58) + 0x18))(), pbVar4 = local_408,
           cVar5 == '{')) {
          psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
          format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_3d8,(detail *)local_400._M_current,local_1b0,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )v);
          concat_to_string<char_const(&)[51],std::__cxx11::string,char_const(&)[34]>
                    (&local_3b8,(toml *)"toml::insert_value: inserting to an inline table (",
                     (char (*) [51])&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") but inline tables are immutable",(char (*) [34])iter._M_current);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)this,key_curr._M_current);
          source_location::source_location
                    ((source_location *)local_378,
                     (pmVar14->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[28],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_318,(source_location *)local_378,(char (*) [28])0x197477);
          source_location::source_location
                    ((source_location *)local_218,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[15],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,(source_location *)local_218,(char (*) [15])"inserting this");
          __l_00._M_len = 2;
          __l_00._M_array = (iterator)local_318;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_428,__l_00,(allocator_type *)&local_238);
          local_3f8._0_8_ = (pointer)0x0;
          local_3f8._8_8_ = (pointer)0x0;
          local_3f8._16_8_ = (pointer)0x0;
          format_underline(&local_398,&local_3b8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_428,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_3f8,false);
          source_location::source_location
                    (&local_1a8,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
          __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,key_curr._M_current);
        this = (detail *)
               basic_value<toml::discard_comments,std::unordered_map,std::vector>::
               as_table_abi_cxx11_((basic_value<toml::discard_comments,std::unordered_map,std::vector>
                                    *)pmVar9);
      }
      else {
        if (iVar10.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00121140;
        if (*(char *)((long)iVar10.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_true>
                            ._M_cur + 0x28) != '\t') {
          psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
          format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_3d8,(detail *)local_400._M_current,local_1b0,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )v);
          pcVar15 = ") is neither table nor an array of tables";
          concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[42]>
                    (&local_3b8,(toml *)"toml::insert_value: target (",(char (*) [29])&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") is neither table nor an array of tables",(char (*) [42])iter._M_current);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)this,key_curr._M_current);
          source_location::source_location
                    ((source_location *)local_378,
                     (pmVar14->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)this,key_curr._M_current);
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_158.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,pmVar14->type_);
          concat_to_string<char_const(&)[16],toml::value_t>
                    (&local_428,(toml *)0x1975ea,(char (*) [16])&local_158,(value_t *)pcVar15);
          local_318._8_4_ = local_378._8_4_;
          local_318._0_8_ = local_378._0_8_;
          local_308._M_allocated_capacity = (size_type)local_2f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_allocated_capacity == &local_358) {
            local_2f8._8_8_ = local_358._8_8_;
          }
          else {
            local_308._M_allocated_capacity = local_368._M_allocated_capacity;
          }
          local_2f8._0_8_ = local_358._M_allocated_capacity;
          local_2f8._16_8_ = local_2d8;
          local_308._8_8_ = local_368._8_8_;
          local_368._8_8_ = 0;
          local_358._M_allocated_capacity = local_358._M_allocated_capacity & 0xffffffffffffff00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_allocated_capacity == &local_338) {
            local_2d8._8_8_ = local_338._8_8_;
          }
          else {
            local_2f8._16_8_ = local_348._M_allocated_capacity;
          }
          local_2c8._M_p = (pointer)&local_2b8;
          local_2f8._24_8_ = local_348._8_8_;
          local_348._8_8_ = 0;
          local_338._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p == &local_428.field_2) {
            local_2b8._8_8_ = local_428.field_2._8_8_;
          }
          else {
            local_2c8._M_p = local_428._M_dataplus._M_p;
          }
          local_2c0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._M_string_length;
          local_428._M_string_length = 0;
          local_428.field_2._M_local_buf[0] = '\0';
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          local_368._M_allocated_capacity = (size_type)&local_358;
          local_348._M_allocated_capacity = (size_type)&local_338;
          source_location::source_location
                    ((source_location *)local_218,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[15],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,(source_location *)local_218,(char (*) [15])"inserting this");
          __l_06._M_len = 2;
          __l_06._M_array = (iterator)local_318;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_3f8,__l_06,&local_429);
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_398,&local_3b8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3f8,&local_238,false);
          source_location::source_location
                    (&local_1a8,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
          __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,key_curr._M_current);
        paVar11 = basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_array
                            (pmVar9);
        pbVar4 = local_408;
        pbVar2 = (paVar11->
                 super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (*(char *)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&pbVar2[-1].type_)->_M_impl).super__Vector_impl_data._M_start != '\n') {
          psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
          format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_3d8,(detail *)local_400._M_current,local_1b0,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )v);
          pcVar15 = ") is neither table nor an array of tables";
          concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[42]>
                    (&local_3b8,(toml *)"toml::insert_value: target (",(char (*) [29])&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") is neither table nor an array of tables",(char (*) [42])iter._M_current);
          source_location::source_location
                    ((source_location *)local_378,
                     (paVar11->
                     super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].region_info_.
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_158.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 (paVar11->
                                 super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish[-1].type_);
          concat_to_string<char_const(&)[16],toml::value_t>
                    (&local_428,(toml *)0x1975ea,(char (*) [16])&local_158,(value_t *)pcVar15);
          local_318._8_4_ = local_378._8_4_;
          local_318._0_8_ = local_378._0_8_;
          local_308._M_allocated_capacity = (size_type)local_2f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_allocated_capacity == &local_358) {
            local_2f8._8_8_ = local_358._8_8_;
          }
          else {
            local_308._M_allocated_capacity = local_368._M_allocated_capacity;
          }
          local_2f8._0_8_ = local_358._M_allocated_capacity;
          local_2f8._16_8_ = local_2d8;
          local_308._8_8_ = local_368._8_8_;
          local_368._8_8_ = 0;
          local_358._M_allocated_capacity = local_358._M_allocated_capacity & 0xffffffffffffff00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_allocated_capacity == &local_338) {
            local_2d8._8_8_ = local_338._8_8_;
          }
          else {
            local_2f8._16_8_ = local_348._M_allocated_capacity;
          }
          local_2c8._M_p = (pointer)&local_2b8;
          local_2f8._24_8_ = local_348._8_8_;
          local_348._8_8_ = 0;
          local_338._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p == &local_428.field_2) {
            local_2b8._8_8_ = local_428.field_2._8_8_;
          }
          else {
            local_2c8._M_p = local_428._M_dataplus._M_p;
          }
          local_2c0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._M_string_length;
          local_428._M_string_length = 0;
          local_428.field_2._M_local_buf[0] = '\0';
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          local_368._M_allocated_capacity = (size_type)&local_358;
          local_348._M_allocated_capacity = (size_type)&local_338;
          source_location::source_location
                    ((source_location *)local_218,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[15],_true>
                    ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2a8,(source_location *)local_218,(char (*) [15])"inserting this");
          __l_05._M_len = 2;
          __l_05._M_array = (iterator)local_318;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_3f8,__l_05,&local_429);
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_398,&local_3b8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_3f8,&local_238,false);
          source_location::source_location
                    (&local_1a8,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
          __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        v = (paVar11->
            super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
        if (v == pbVar2) {
          psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
          format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (&local_3d8,(detail *)local_400._M_current,local_320,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )v);
          concat_to_string<char_const(&)[29],std::__cxx11::string,char_const(&)[33]>
                    (&local_3b8,(toml *)"toml::insert_value: table (\"",(char (*) [29])&local_3d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\") conflicts with existing value",(char (*) [33])iter._M_current);
          pmVar14 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                          *)this,key_curr._M_current);
          source_location::source_location
                    ((source_location *)local_378,
                     (pmVar14->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          paVar1 = &local_428.field_2;
          local_428._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_428,"this array is not insertable","");
          local_318._8_4_ = local_378._8_4_;
          local_318._0_8_ = local_378._0_8_;
          local_308._M_allocated_capacity = (size_type)local_2f8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_allocated_capacity == &local_358) {
            local_2f8._8_8_ = local_358._8_8_;
          }
          else {
            local_308._M_allocated_capacity = local_368._M_allocated_capacity;
          }
          local_2f8._0_8_ = local_358._M_allocated_capacity;
          local_2f8._16_8_ = local_2d8;
          local_308._8_8_ = local_368._8_8_;
          local_368._8_8_ = 0;
          local_358._M_allocated_capacity = local_358._M_allocated_capacity & 0xffffffffffffff00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_allocated_capacity == &local_338) {
            local_2d8._8_8_ = local_338._8_8_;
          }
          else {
            local_2f8._16_8_ = local_348._M_allocated_capacity;
          }
          local_2c8._M_p = (pointer)&local_2b8;
          local_2f8._24_8_ = local_348._8_8_;
          local_348._8_8_ = 0;
          local_338._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p == paVar1) {
            local_2b8._8_8_ = local_428.field_2._8_8_;
          }
          else {
            local_2c8._M_p = local_428._M_dataplus._M_p;
          }
          local_2c0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._M_string_length;
          local_428._M_string_length = 0;
          local_428.field_2._M_local_buf[0] = '\0';
          local_428._M_dataplus._M_p = (pointer)paVar1;
          local_368._M_allocated_capacity = (size_type)&local_358;
          local_348._M_allocated_capacity = (size_type)&local_338;
          source_location::source_location
                    ((source_location *)local_218,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          local_3f8._0_8_ = local_3f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3f8,"appending it to the statically sized array","");
          local_2a0 = (uint_least32_t)pbStack_210;
          local_2a8 = (pointer)local_218;
          local_298._M_p = (pointer)&local_288;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_p == &local_1f8) {
            local_288._8_8_ = local_1f8._8_8_;
          }
          else {
            local_298._M_p = local_208._M_p;
          }
          local_278._M_p = (pointer)&local_268;
          local_290 = local_200;
          local_200 = 0;
          local_1f8._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_p == &local_1d8) {
            local_268._8_8_ = local_1d8._8_8_;
          }
          else {
            local_278._M_p = local_1e8._M_p;
          }
          local_258._M_p = local_248;
          local_270 = local_1e0;
          local_1e0 = 0;
          local_1d8._M_local_buf[0] = '\0';
          if ((pointer)local_3f8._0_8_ == (pointer)(local_3f8 + 0x10)) {
            local_248[8] = (undefined1)uStack_3e0;
            local_248[9] = uStack_3e0._1_1_;
            local_248[10] = uStack_3e0._2_1_;
            local_248[0xb] = uStack_3e0._3_1_;
            local_248[0xc] = uStack_3e0._4_1_;
            local_248[0xd] = uStack_3e0._5_1_;
            local_248[0xe] = uStack_3e0._6_1_;
            local_248[0xf] = uStack_3e0._7_1_;
          }
          else {
            local_258._M_p = (pointer)local_3f8._0_8_;
          }
          local_250 = (pointer)local_3f8._8_8_;
          local_3f8._0_8_ = local_3f8 + 0x10;
          local_3f8._8_8_ = (pointer)0x0;
          local_3f8._16_8_ = local_3f8._16_8_ & 0xffffffffffffff00;
          __l_08._M_len = 2;
          __l_08._M_array = (iterator)local_318;
          local_208._M_p = (pointer)&local_1f8;
          local_1e8._M_p = (pointer)&local_1d8;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_238,__l_08,&local_429);
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          format_underline(&local_398,&local_3b8,
                           (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_238,&local_158,false);
          source_location::source_location
                    (&local_1a8,
                     (region_base *)
                     (pbVar4->region_info_).
                     super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
          __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        peVar3 = (v->region_info_).
                 super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar3 != (element_type *)0x0) {
          (*peVar3->_vptr_region_base[4])(local_378);
          v = (pointer)0x2;
          std::__cxx11::string::substr((ulong)local_318,(ulong)local_378);
          iVar7 = std::__cxx11::string::compare(local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._0_8_ != &local_308) {
            operator_delete((void *)local_318._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_368._M_allocated_capacity + 1));
          }
          pbVar4 = local_408;
          if (iVar7 != 0) {
            psVar13 = (syntax_error *)__cxa_allocate_exception(0x78);
            format_dotted_keys<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (&local_3d8,(detail *)local_400._M_current,local_320,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )v);
            concat_to_string<char_const(&)[31],std::__cxx11::string,char_const(&)[60]>
                      (&local_3b8,(toml *)"toml::insert_value: a table (\"",
                       (char (*) [31])&local_3d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\") cannot be inserted to an existing inline array-of-tables",
                       (char (*) [60])iter._M_current);
            pmVar14 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                      ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                            *)this,key_curr._M_current);
            source_location::source_location
                      ((source_location *)local_378,
                       (pmVar14->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            paVar1 = &local_428.field_2;
            local_428._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_428,"this array of table has a static size","");
            local_318._8_4_ = local_378._8_4_;
            local_318._0_8_ = local_378._0_8_;
            local_308._M_allocated_capacity = (size_type)local_2f8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_allocated_capacity == &local_358) {
              local_2f8._8_8_ = local_358._8_8_;
            }
            else {
              local_308._M_allocated_capacity = local_368._M_allocated_capacity;
            }
            local_2f8._0_8_ = local_358._M_allocated_capacity;
            local_2f8._16_8_ = local_2d8;
            local_308._8_8_ = local_368._8_8_;
            local_368._8_8_ = 0;
            local_358._M_allocated_capacity = local_358._M_allocated_capacity & 0xffffffffffffff00;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_allocated_capacity == &local_338) {
              local_2d8._8_8_ = local_338._8_8_;
            }
            else {
              local_2f8._16_8_ = local_348._M_allocated_capacity;
            }
            local_2c8._M_p = (pointer)&local_2b8;
            local_2f8._24_8_ = local_348._8_8_;
            local_348._8_8_ = 0;
            local_338._M_local_buf[0] = '\0';
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p == paVar1) {
              local_2b8._8_8_ = local_428.field_2._8_8_;
            }
            else {
              local_2c8._M_p = local_428._M_dataplus._M_p;
            }
            local_2c0._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._M_string_length;
            local_428._M_string_length = 0;
            local_428.field_2._M_local_buf[0] = '\0';
            local_428._M_dataplus._M_p = (pointer)paVar1;
            local_368._M_allocated_capacity = (size_type)&local_358;
            local_348._M_allocated_capacity = (size_type)&local_338;
            source_location::source_location
                      ((source_location *)local_218,
                       (region_base *)
                       (pbVar4->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            local_3f8._0_8_ = local_3f8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f8,"appending it to the statically sized array","");
            local_2a0 = (uint_least32_t)pbStack_210;
            local_2a8 = (pointer)local_218;
            local_298._M_p = (pointer)&local_288;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_p == &local_1f8) {
              local_288._8_8_ = local_1f8._8_8_;
            }
            else {
              local_298._M_p = local_208._M_p;
            }
            local_278._M_p = (pointer)&local_268;
            local_290 = local_200;
            local_200 = 0;
            local_1f8._M_local_buf[0] = '\0';
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_p == &local_1d8) {
              local_268._8_8_ = local_1d8._8_8_;
            }
            else {
              local_278._M_p = local_1e8._M_p;
            }
            local_258._M_p = local_248;
            local_270 = local_1e0;
            local_1e0 = 0;
            local_1d8._M_local_buf[0] = '\0';
            if ((pointer)local_3f8._0_8_ == (pointer)(local_3f8 + 0x10)) {
              local_248[8] = (undefined1)uStack_3e0;
              local_248[9] = uStack_3e0._1_1_;
              local_248[10] = uStack_3e0._2_1_;
              local_248[0xb] = uStack_3e0._3_1_;
              local_248[0xc] = uStack_3e0._4_1_;
              local_248[0xd] = uStack_3e0._5_1_;
              local_248[0xe] = uStack_3e0._6_1_;
              local_248[0xf] = uStack_3e0._7_1_;
            }
            else {
              local_258._M_p = (pointer)local_3f8._0_8_;
            }
            local_250 = (pointer)local_3f8._8_8_;
            local_3f8._0_8_ = local_3f8 + 0x10;
            local_3f8._8_8_ = (pointer)0x0;
            local_3f8._16_8_ = local_3f8._16_8_ & 0xffffffffffffff00;
            __l_10._M_len = 2;
            __l_10._M_array = (iterator)local_318;
            local_208._M_p = (pointer)&local_1f8;
            local_1e8._M_p = (pointer)&local_1d8;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_238,__l_10,&local_429);
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_398,&local_3b8,
                             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_238,&local_158,false);
            source_location::source_location
                      (&local_1a8,
                       (region_base *)
                       (pbVar4->region_info_).
                       super___shared_ptr<toml::detail::region_base,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            syntax_error::syntax_error(psVar13,&local_398,&local_1a8);
            __cxa_throw(psVar13,&syntax_error::typeinfo,syntax_error::~syntax_error);
          }
        }
        this = (detail *)
               basic_value<toml::discard_comments,std::unordered_map,std::vector>::
               as_table_abi_cxx11_((basic_value<toml::discard_comments,std::unordered_map,std::vector>
                                    *)((paVar11->
                                       super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish + -1));
        key_last._M_current = local_320._M_current;
      }
    }
    key_curr._M_current = local_1b0._M_current;
    if (local_1b0._M_current == key_last._M_current) {
      return local_1c0;
    }
  } while( true );
}

Assistant:

result<bool, std::string>
insert_nested_key(typename Value::table_type& root, const Value& v,
                  InputIterator iter, const InputIterator last,
                  region key_reg,
                  const bool is_array_of_table = false)
{
    static_assert(std::is_same<key,
        typename std::iterator_traits<InputIterator>::value_type>::value,"");

    using value_type = Value;
    using table_type = typename value_type::table_type;
    using array_type = typename value_type::array_type;

    const auto first = iter;
    assert(iter != last);

    table_type* tab = std::addressof(root);
    for(; iter != last; ++iter) // search recursively
    {
        const key& k = *iter;
        if(std::next(iter) == last) // k is the last key
        {
            // XXX if the value is array-of-tables, there can be several
            //     tables that are in the same array. in that case, we need to
            //     find the last element and insert it to there.
            if(is_array_of_table)
            {
                if(tab->count(k) == 1) // there is already an array of table
                {
                    if(tab->at(k).is_table())
                    {
                        // show special err msg for conflicting table
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: array of table (\"",
                            format_dotted_keys(first, last),
                            "\") cannot be defined"), {
                                {tab->at(k).location(), "table already defined"},
                                {v.location(), "this conflicts with the previous table"}
                            }), v.location());
                    }
                    else if(!(tab->at(k).is_array()))
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: array of table (\"",
                            format_dotted_keys(first, last), "\") collides with"
                            " existing value"), {
                                {tab->at(k).location(),
                                 concat_to_string("this ", tab->at(k).type(),
                                                  " value already exists")},
                                {v.location(),
                                 "while inserting this array-of-tables"}
                            }), v.location());
                    }
                    // the above if-else-if checks tab->at(k) is an array
                    auto& a = tab->at(k).as_array();
                    // If table element is defined as [[array_of_tables]], it
                    // cannot be an empty array. If an array of tables is
                    // defined as `aot = []`, it cannot be appended.
                    if(a.empty() || !(a.front().is_table()))
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: array of table (\"",
                            format_dotted_keys(first, last), "\") collides with"
                            " existing value"), {
                                {tab->at(k).location(),
                                 concat_to_string("this ", tab->at(k).type(),
                                                  " value already exists")},
                                {v.location(),
                                 "while inserting this array-of-tables"}
                            }), v.location());
                    }
                    // avoid conflicting array of table like the following.
                    // ```toml
                    // a = [{b = 42}] # define a as an array of *inline* tables
                    // [[a]]          # a is an array of *multi-line* tables
                    // b = 54
                    // ```
                    // Here, from the type information, these cannot be detected
                    // because inline table is also a table.
                    // But toml v0.5.0 explicitly says it is invalid. The above
                    // array-of-tables has a static size and appending to the
                    // array is invalid.
                    // In this library, multi-line table value has a region
                    // that points to the key of the table (e.g. [[a]]). By
                    // comparing the first two letters in key, we can detect
                    // the array-of-table is inline or multiline.
                    if(const auto ptr = detail::get_region(a.front()))
                    {
                        if(ptr->str().substr(0,2) != "[[")
                        {
                            throw syntax_error(format_underline(concat_to_string(
                                "toml::insert_value: array of table (\"",
                                format_dotted_keys(first, last), "\") collides "
                                "with existing array-of-tables"), {
                                    {tab->at(k).location(),
                                     concat_to_string("this ", tab->at(k).type(),
                                                      " value has static size")},
                                    {v.location(),
                                     "appending it to the statically sized array"}
                                }), v.location());
                        }
                    }
                    a.push_back(v);
                    return ok(true);
                }
                else // if not, we need to create the array of table
                {
                    // XXX: Consider the following array of tables.
                    // ```toml
                    // # This is a comment.
                    // [[aot]]
                    // foo = "bar"
                    // ```
                    // Here, the comment is for `aot`. But here, actually two
                    // values are defined. An array that contains tables, named
                    // `aot`, and the 0th element of the `aot`, `{foo = "bar"}`.
                    // Those two are different from each other. But both of them
                    // points to the same portion of the TOML file, `[[aot]]`,
                    // so `key_reg.comments()` returns `# This is a comment`.
                    // If it is assigned as a comment of `aot` defined here, the
                    // comment will be duplicated. Both the `aot` itself and
                    // the 0-th element will have the same comment. This causes
                    // "duplication of the same comments" bug when the data is
                    // serialized.
                    //     Next, consider the following.
                    // ```toml
                    // # comment 1
                    // aot = [
                    //     # comment 2
                    //     {foo = "bar"},
                    // ]
                    // ```
                    // In this case, we can distinguish those two comments. So
                    // here we need to add "comment 1" to the `aot` and
                    // "comment 2" to the 0th element of that.
                    //     To distinguish those two, we check the key region.
                    std::vector<std::string> comments{/* empty by default */};
                    if(key_reg.str().substr(0, 2) != "[[")
                    {
                        comments = key_reg.comments();
                    }
                    value_type aot(array_type(1, v), key_reg, std::move(comments));
                    tab->insert(std::make_pair(k, aot));
                    return ok(true);
                }
            } // end if(array of table)

            if(tab->count(k) == 1)
            {
                if(tab->at(k).is_table() && v.is_table())
                {
                    if(!is_valid_forward_table_definition(
                                tab->at(k), v, first, iter, last))
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: table (\"",
                            format_dotted_keys(first, last),
                            "\") already exists."), {
                                {tab->at(k).location(), "table already exists here"},
                                {v.location(), "table defined twice"}
                            }), v.location());
                    }
                    // to allow the following toml file.
                    // [a.b.c]
                    // d = 42
                    // [a]
                    // e = 2.71
                    auto& t = tab->at(k).as_table();
                    for(const auto& kv : v.as_table())
                    {
                        if(tab->at(k).contains(kv.first))
                        {
                            throw syntax_error(format_underline(concat_to_string(
                                "toml::insert_value: value (\"",
                                format_dotted_keys(first, last),
                                "\") already exists."), {
                                    {t.at(kv.first).location(), "already exists here"},
                                    {v.location(), "this defined twice"}
                                }), v.location());
                        }
                        t[kv.first] = kv.second;
                    }
                    detail::change_region(tab->at(k), key_reg);
                    return ok(true);
                }
                else if(v.is_table()                     &&
                        tab->at(k).is_array()            &&
                        tab->at(k).as_array().size() > 0 &&
                        tab->at(k).as_array().front().is_table())
                {
                    throw syntax_error(format_underline(concat_to_string(
                        "toml::insert_value: array of tables (\"",
                        format_dotted_keys(first, last), "\") already exists."), {
                            {tab->at(k).location(), "array of tables defined here"},
                            {v.location(), "table conflicts with the previous array of table"}
                        }), v.location());
                }
                else
                {
                    throw syntax_error(format_underline(concat_to_string(
                        "toml::insert_value: value (\"",
                        format_dotted_keys(first, last), "\") already exists."), {
                            {tab->at(k).location(), "value already exists here"},
                            {v.location(), "value defined twice"}
                        }), v.location());
                }
            }
            tab->insert(std::make_pair(k, v));
            return ok(true);
        }
        else // k is not the last one, we should insert recursively
        {
            // if there is no corresponding value, insert it first.
            // related: you don't need to write
            // # [x]
            // # [x.y]
            // to write
            // [x.y.z]
            if(tab->count(k) == 0)
            {
                // a table that is defined implicitly doesn't have any comments.
                (*tab)[k] = value_type(table_type{}, key_reg, {/*no comment*/});
            }

            // type checking...
            if(tab->at(k).is_table())
            {
                // According to toml-lang/toml:36d3091b3 "Clarify that inline
                // tables are immutable", check if it adds key-value pair to an
                // inline table.
                if(const auto* ptr = get_region(tab->at(k)))
                {
                    // here, if the value is a (multi-line) table, the region
                    // should be something like `[table-name]`.
                    if(ptr->front() == '{')
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: inserting to an inline table (",
                            format_dotted_keys(first, std::next(iter)),
                            ") but inline tables are immutable"), {
                                {tab->at(k).location(), "inline tables are immutable"},
                                {v.location(), "inserting this"}
                            }), v.location());
                    }
                }
                tab = std::addressof((*tab)[k].as_table());
            }
            else if(tab->at(k).is_array()) // inserting to array-of-tables?
            {
                auto& a = (*tab)[k].as_array();
                if(!a.back().is_table())
                {
                    throw syntax_error(format_underline(concat_to_string(
                        "toml::insert_value: target (",
                        format_dotted_keys(first, std::next(iter)),
                        ") is neither table nor an array of tables"), {
                            {a.back().location(), concat_to_string(
                                    "actual type is ", a.back().type())},
                            {v.location(), "inserting this"}
                        }), v.location());
                }
                if(a.empty())
                {
                    throw syntax_error(format_underline(concat_to_string(
                        "toml::insert_value: table (\"",
                        format_dotted_keys(first, last), "\") conflicts with"
                        " existing value"), {
                            {tab->at(k).location(), std::string("this array is not insertable")},
                            {v.location(), std::string("appending it to the statically sized array")}
                        }), v.location());
                }
                if(const auto ptr = detail::get_region(a.at(0)))
                {
                    if(ptr->str().substr(0,2) != "[[")
                    {
                        throw syntax_error(format_underline(concat_to_string(
                            "toml::insert_value: a table (\"",
                            format_dotted_keys(first, last), "\") cannot be "
                            "inserted to an existing inline array-of-tables"), {
                                {tab->at(k).location(), std::string("this array of table has a static size")},
                                {v.location(), std::string("appending it to the statically sized array")}
                            }), v.location());
                    }
                }
                tab = std::addressof(a.back().as_table());
            }
            else
            {
                throw syntax_error(format_underline(concat_to_string(
                    "toml::insert_value: target (",
                    format_dotted_keys(first, std::next(iter)),
                    ") is neither table nor an array of tables"), {
                        {tab->at(k).location(), concat_to_string(
                                "actual type is ", tab->at(k).type())},
                        {v.location(), "inserting this"}
                    }), v.location());
            }
        }
    }
    return err(std::string("toml::detail::insert_nested_key: never reach here"));
}